

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrWorldMeshBlockML *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  undefined8 uVar2;
  XrWorldMeshBlockML *pXVar3;
  bool bVar4;
  XrInstance pXVar5;
  string *value_01;
  invalid_argument *piVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028 [36];
  int local_1004;
  ostringstream local_1000 [8];
  ostringstream oss_confidenceBuffer;
  string local_e88 [8];
  string confidencebuffer_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68 [32];
  ostringstream local_e48 [8];
  ostringstream oss_confidenceCount;
  string local_cd0 [8];
  string confidencecount_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0 [32];
  ostringstream local_c90 [8];
  ostringstream oss_normalBuffer;
  string local_b18 [8];
  string normalbuffer_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8 [32];
  ostringstream local_ad8 [8];
  ostringstream oss_normalCount;
  string local_960 [8];
  string normalcount_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940 [32];
  ostringstream local_920 [8];
  ostringstream oss_vertexBuffer;
  string local_7a8 [8];
  string vertexbuffer_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [32];
  ostringstream local_768 [8];
  ostringstream oss_vertexCount;
  string local_5f0 [8];
  string vertexcount_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0 [32];
  ostringstream local_5b0 [8];
  ostringstream oss_indexBuffer;
  string local_438 [8];
  string indexbuffer_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  ostringstream local_3f8 [8];
  ostringstream oss_indexCount;
  string local_280 [8];
  string indexcount_prefix;
  __cxx11 local_260 [32];
  string local_240 [8];
  string flags_prefix;
  __cxx11 local_220 [32];
  string local_200 [8];
  string lod_prefix;
  __cxx11 local_1e0 [32];
  string local_1c0 [8];
  string blockresult_prefix;
  allocator local_199;
  string local_198 [32];
  string local_178 [32];
  string local_158 [8];
  string uuid_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  undefined1 local_60 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrWorldMeshBlockML *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60._32_8_ = contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrWorldMeshBlockML *)gen_dispatch_table;
  PointerToHexString<XrWorldMeshBlockML>((XrWorldMeshBlockML *)local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  uVar2 = local_60._32_8_;
  if (value_local == (XrWorldMeshBlockML *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = *(code **)&value_local->vertexCount;
    pXVar5 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar5,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60._32_8_,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar3 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar4 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar3,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_138);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_158,(string *)prefix);
    std::__cxx11::string::operator+=(local_158,"uuid");
    pXVar3 = value_local;
    value_01 = prefix_local + 0x10;
    std::__cxx11::string::string(local_178,local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"XrUuidEXT",&local_199);
    bVar4 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar3,(XrUuid *)value_01,(string *)local_178,
                       (string *)local_198,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_60._32_8_);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::__cxx11::string::~string(local_178);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string(local_1c0,(string *)prefix);
      std::__cxx11::string::operator+=(local_1c0,"blockResult");
      uVar2 = local_60._32_8_;
      std::__cxx11::to_string(local_1e0,*(int *)(prefix_local + 0x20));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [25])"XrWorldMeshBlockResultML",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::string(local_200,(string *)prefix);
      std::__cxx11::string::operator+=(local_200,"lod");
      uVar2 = local_60._32_8_;
      std::__cxx11::to_string(local_220,*(int *)(prefix_local + 0x24));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [25])"XrWorldMeshDetectorLodML",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::string(local_240,(string *)prefix);
      std::__cxx11::string::operator+=(local_240,"flags");
      uVar2 = local_60._32_8_;
      std::__cxx11::to_string(local_260,*(unsigned_long *)(prefix_local + 0x28));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [27])"XrWorldMeshDetectorFlagsML",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::string(local_280,(string *)prefix);
      std::__cxx11::string::operator+=(local_280,"indexCount");
      std::__cxx11::ostringstream::ostringstream(local_3f8);
      poVar7 = std::operator<<((ostream *)local_3f8,"0x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x30));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 local_418);
      std::__cxx11::string::~string((string *)local_418);
      std::__cxx11::string::string(local_438,(string *)prefix);
      std::__cxx11::string::operator+=(local_438,"indexBuffer");
      std::__cxx11::ostringstream::ostringstream(local_5b0);
      poVar7 = std::operator<<((ostream *)local_5b0,"0x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x38));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[10],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [10])"uint16_t*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 local_5d0);
      std::__cxx11::string::~string((string *)local_5d0);
      std::__cxx11::string::string(local_5f0,(string *)prefix);
      std::__cxx11::string::operator+=(local_5f0,"vertexCount");
      std::__cxx11::ostringstream::ostringstream(local_768);
      poVar7 = std::operator<<((ostream *)local_768,"0x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x40));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0,
                 local_788);
      std::__cxx11::string::~string((string *)local_788);
      std::__cxx11::string::string(local_7a8,(string *)prefix);
      std::__cxx11::string::operator+=(local_7a8,"vertexBuffer");
      std::__cxx11::ostringstream::ostringstream(local_920);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_920,std::hex);
      std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x48));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [12])0x301dc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8,
                 local_940);
      std::__cxx11::string::~string((string *)local_940);
      std::__cxx11::string::string(local_960,(string *)prefix);
      std::__cxx11::string::operator+=(local_960,"normalCount");
      std::__cxx11::ostringstream::ostringstream(local_ad8);
      poVar7 = std::operator<<((ostream *)local_ad8,"0x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x50));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_960,
                 local_af8);
      std::__cxx11::string::~string((string *)local_af8);
      std::__cxx11::string::string(local_b18,(string *)prefix);
      std::__cxx11::string::operator+=(local_b18,"normalBuffer");
      std::__cxx11::ostringstream::ostringstream(local_c90);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_c90,std::hex);
      std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x58));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [12])0x301dc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b18,
                 local_cb0);
      std::__cxx11::string::~string((string *)local_cb0);
      std::__cxx11::string::string(local_cd0,(string *)prefix);
      std::__cxx11::string::operator+=(local_cd0,"confidenceCount");
      std::__cxx11::ostringstream::ostringstream(local_e48);
      poVar7 = std::operator<<((ostream *)local_e48,"0x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x60));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd0,
                 local_e68);
      std::__cxx11::string::~string((string *)local_e68);
      std::__cxx11::string::string(local_e88,(string *)prefix);
      std::__cxx11::string::operator+=(local_e88,"confidenceBuffer");
      std::__cxx11::ostringstream::ostringstream(local_1000);
      local_1004 = (int)std::setprecision(0x20);
      poVar7 = std::operator<<((ostream *)local_1000,(_Setprecision)local_1004);
      std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x68));
      uVar2 = local_60._32_8_;
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)uVar2,(char (*) [7])0x30277c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e88,
                 local_1028);
      std::__cxx11::string::~string((string *)local_1028);
      gen_dispatch_table_local._7_1_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1000);
      std::__cxx11::string::~string(local_e88);
      std::__cxx11::ostringstream::~ostringstream(local_e48);
      std::__cxx11::string::~string(local_cd0);
      std::__cxx11::ostringstream::~ostringstream(local_c90);
      std::__cxx11::string::~string(local_b18);
      std::__cxx11::ostringstream::~ostringstream(local_ad8);
      std::__cxx11::string::~string(local_960);
      std::__cxx11::ostringstream::~ostringstream(local_920);
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::ostringstream::~ostringstream(local_768);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::ostringstream::~ostringstream(local_5b0);
      std::__cxx11::string::~string(local_438);
      std::__cxx11::ostringstream::~ostringstream(local_3f8);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_90);
      return (bool)(gen_dispatch_table_local._7_1_ & 1);
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrWorldMeshBlockML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string uuid_prefix = prefix;
        uuid_prefix += "uuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuid, uuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string blockresult_prefix = prefix;
        blockresult_prefix += "blockResult";
        contents.emplace_back("XrWorldMeshBlockResultML", blockresult_prefix, std::to_string(value->blockResult));
        std::string lod_prefix = prefix;
        lod_prefix += "lod";
        contents.emplace_back("XrWorldMeshDetectorLodML", lod_prefix, std::to_string(value->lod));
        std::string flags_prefix = prefix;
        flags_prefix += "flags";
        contents.emplace_back("XrWorldMeshDetectorFlagsML", flags_prefix, std::to_string(value->flags));
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indexbuffer_prefix = prefix;
        indexbuffer_prefix += "indexBuffer";
        std::ostringstream oss_indexBuffer;
        oss_indexBuffer << "0x" << std::hex << (value->indexBuffer);
        contents.emplace_back("uint16_t*", indexbuffer_prefix, oss_indexBuffer.str());
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertexbuffer_prefix = prefix;
        vertexbuffer_prefix += "vertexBuffer";
        std::ostringstream oss_vertexBuffer;
        oss_vertexBuffer << std::hex << reinterpret_cast<const void*>(value->vertexBuffer);
        contents.emplace_back("XrVector3f*", vertexbuffer_prefix, oss_vertexBuffer.str());
        std::string normalcount_prefix = prefix;
        normalcount_prefix += "normalCount";
        std::ostringstream oss_normalCount;
        oss_normalCount << "0x" << std::hex << (value->normalCount);
        contents.emplace_back("uint32_t", normalcount_prefix, oss_normalCount.str());
        std::string normalbuffer_prefix = prefix;
        normalbuffer_prefix += "normalBuffer";
        std::ostringstream oss_normalBuffer;
        oss_normalBuffer << std::hex << reinterpret_cast<const void*>(value->normalBuffer);
        contents.emplace_back("XrVector3f*", normalbuffer_prefix, oss_normalBuffer.str());
        std::string confidencecount_prefix = prefix;
        confidencecount_prefix += "confidenceCount";
        std::ostringstream oss_confidenceCount;
        oss_confidenceCount << "0x" << std::hex << (value->confidenceCount);
        contents.emplace_back("uint32_t", confidencecount_prefix, oss_confidenceCount.str());
        std::string confidencebuffer_prefix = prefix;
        confidencebuffer_prefix += "confidenceBuffer";
        std::ostringstream oss_confidenceBuffer;
        oss_confidenceBuffer << std::setprecision(32) << (value->confidenceBuffer);
        contents.emplace_back("float*", confidencebuffer_prefix, oss_confidenceBuffer.str());
        return true;
    } catch(...) {
    }
    return false;
}